

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlPatternGrow(xmlPatternPtr comp)

{
  uint uVar1;
  xmlStepOpPtr pxVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = comp->maxStep;
  iVar3 = -1;
  if ((int)uVar1 < 1) {
    uVar5 = 10;
  }
  else {
    if (999999999 < uVar1) {
      return -1;
    }
    uVar4 = uVar1 + 1 >> 1;
    uVar5 = uVar4 + uVar1;
    if (1000000000 - uVar4 < uVar1) {
      uVar5 = 1000000000;
    }
  }
  pxVar2 = (xmlStepOpPtr)(*xmlRealloc)(comp->steps,(ulong)uVar5 * 0x18);
  if (pxVar2 != (xmlStepOpPtr)0x0) {
    comp->steps = pxVar2;
    comp->maxStep = uVar5;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
xmlPatternGrow(xmlPatternPtr comp) {
    xmlStepOpPtr temp;
    int newSize;

    newSize = xmlGrowCapacity(comp->maxStep, sizeof(temp[0]),
                              10, XML_MAX_ITEMS);
    if (newSize < 0)
        return(-1);
    temp = xmlRealloc(comp->steps, newSize * sizeof(temp[0]));
    if (temp == NULL)
        return(-1);
    comp->steps = temp;
    comp->maxStep = newSize;

    return(0);
}